

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<11,_2,_13,_2,_13>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  MatrixCaseUtils local_104 [12];
  VecAccess<float,_4,_3> local_f8;
  Mat4 local_e0;
  Mat4 local_a0;
  Matrix<float,_4,_4> local_60;
  
  getInputValue<2,13>(&local_a0,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  getInputValue<2,13>(&local_e0,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)&DAT_00000001,in_ECX
                     );
  tcu::operator+(&local_60,&local_a0,&local_e0);
  reduceToVec3(local_104,&local_60);
  local_f8.m_vector = &evalCtx->color;
  local_f8.m_index[0] = 0;
  local_f8.m_index[1] = 1;
  local_f8.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_f8,(Vector<float,_3> *)local_104);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) + getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}